

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JlDataModel.c
# Opt level: O2

JL_STATUS JlSetObjectNumberHex(JlDataObject *NumberObject,uint64_t NumberU64)

{
  JL_STATUS JVar1;
  
  if (NumberObject == (JlDataObject *)0x0) {
    JVar1 = JL_STATUS_INVALID_PARAMETER;
  }
  else {
    if (NumberObject->Type == JL_DATA_TYPE_NUMBER) {
      (NumberObject->field_2).Number.Type = JL_NUM_TYPE_UNSIGNED;
      (NumberObject->field_2).Number.IsHex = true;
      (NumberObject->field_2).Number.field_1.u64 = NumberU64;
      return JL_STATUS_SUCCESS;
    }
    JVar1 = JL_STATUS_WRONG_TYPE;
  }
  return JVar1;
}

Assistant:

JL_STATUS
    JlSetObjectNumberHex
    (
        JlDataObject*   NumberObject,
        uint64_t        NumberU64
    )
{
    JL_STATUS jlStatus;

    if( NULL != NumberObject )
    {
        if( JL_DATA_TYPE_NUMBER == NumberObject->Type )
        {
            NumberObject->Number.Type = JL_NUM_TYPE_UNSIGNED;
            NumberObject->Number.IsHex = true;
            NumberObject->Number.u64 = NumberU64;
            jlStatus = JL_STATUS_SUCCESS;
        }
        else
        {
            jlStatus = JL_STATUS_WRONG_TYPE;
        }
    }
    else
    {
        jlStatus = JL_STATUS_INVALID_PARAMETER;
    }

    return jlStatus;
}